

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closed_file_input_source.cc
# Opt level: O0

int main(void)

{
  ostream *this;
  undefined1 local_2c8 [8];
  FileInputSource f;
  ClosedFileInputSource cf2;
  undefined1 local_f8 [8];
  ClosedFileInputSource cf;
  
  cf._228_4_ = 0;
  std::operator<<((ostream *)&std::cout,"testing with ClosedFileInputSource\n");
  ClosedFileInputSource::ClosedFileInputSource((ClosedFileInputSource *)local_f8,"input");
  do_tests((InputSource *)local_f8);
  std::operator<<((ostream *)&std::cout,"testing with ClosedFileInputSource in stay open mode\n");
  ClosedFileInputSource::ClosedFileInputSource((ClosedFileInputSource *)&f.file,"input");
  ClosedFileInputSource::stayOpen((ClosedFileInputSource *)&f.file,true);
  do_tests((InputSource *)&f.file);
  ClosedFileInputSource::stayOpen((ClosedFileInputSource *)&f.file,false);
  std::operator<<((ostream *)&std::cout,"testing with FileInputSource\n");
  FileInputSource::FileInputSource((FileInputSource *)local_2c8,"input");
  do_tests((InputSource *)local_2c8);
  this = std::operator<<((ostream *)&std::cout,"all assertions passed");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  cf._228_4_ = 0;
  FileInputSource::~FileInputSource((FileInputSource *)local_2c8);
  ClosedFileInputSource::~ClosedFileInputSource((ClosedFileInputSource *)&f.file);
  ClosedFileInputSource::~ClosedFileInputSource((ClosedFileInputSource *)local_f8);
  return cf._228_4_;
}

Assistant:

int
main()
{
    // This test is designed to work with a specified input file.
    std::cout << "testing with ClosedFileInputSource\n";
    ClosedFileInputSource cf("input");
    do_tests(&cf);
    std::cout << "testing with ClosedFileInputSource in stay open mode\n";
    ClosedFileInputSource cf2("input");
    cf2.stayOpen(true);
    do_tests(&cf2);
    cf2.stayOpen(false);
    std::cout << "testing with FileInputSource\n";
    FileInputSource f("input");
    do_tests(&f);
    std::cout << "all assertions passed" << std::endl;
    return 0;
}